

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_descriptor_set_layout
          (Impl *this,VkDescriptorSetLayoutCreateInfo *create_info,ScratchAllocator *alloc,
          VkDescriptorSetLayoutCreateInfo **out_create_info)

{
  VkDescriptorSetLayoutBinding *__src;
  void *pvVar1;
  uint32_t uVar2;
  VkStructureType VVar3;
  undefined4 uVar4;
  bool bVar5;
  VkDescriptorSetLayoutCreateInfo *pVVar6;
  VkDescriptorSetLayoutBinding *pVVar7;
  void *__dest;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  
  pVVar6 = (VkDescriptorSetLayoutCreateInfo *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (pVVar6 != (VkDescriptorSetLayoutCreateInfo *)0x0) {
    VVar3 = create_info->sType;
    uVar4 = *(undefined4 *)&create_info->field_0x4;
    pvVar1 = create_info->pNext;
    uVar2 = create_info->bindingCount;
    pVVar7 = create_info->pBindings;
    pVVar6->flags = create_info->flags;
    pVVar6->bindingCount = uVar2;
    pVVar6->pBindings = pVVar7;
    pVVar6->sType = VVar3;
    *(undefined4 *)&pVVar6->field_0x4 = uVar4;
    pVVar6->pNext = pvVar1;
  }
  if ((ulong)pVVar6->bindingCount == 0) {
    pVVar7 = (VkDescriptorSetLayoutBinding *)0x0;
  }
  else {
    __src = pVVar6->pBindings;
    sVar9 = (ulong)pVVar6->bindingCount * 0x18;
    pVVar7 = (VkDescriptorSetLayoutBinding *)ScratchAllocator::allocate_raw(alloc,sVar9,0x10);
    if (pVVar7 != (VkDescriptorSetLayoutBinding *)0x0) {
      memmove(pVVar7,__src,sVar9);
    }
  }
  pVVar6->pBindings = pVVar7;
  if (pVVar6->bindingCount != 0) {
    lVar10 = 0x10;
    uVar11 = 0;
    do {
      pVVar7 = pVVar6->pBindings;
      pvVar1 = *(void **)((long)&pVVar7->binding + lVar10);
      if (((pvVar1 == (void *)0x0) || (1 < *(uint *)((long)pVVar7 + lVar10 + -0xc))) ||
         (uVar8 = (ulong)*(uint *)((long)pVVar7 + lVar10 + -8), uVar8 == 0)) {
        __dest = (void *)0x0;
      }
      else {
        sVar9 = uVar8 << 3;
        __dest = ScratchAllocator::allocate_raw(alloc,sVar9,0x10);
        if (__dest != (void *)0x0) {
          memmove(__dest,pvVar1,sVar9);
        }
      }
      *(void **)((long)&pVVar7->binding + lVar10) = __dest;
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x18;
    } while (uVar11 < pVVar6->bindingCount);
  }
  bVar5 = copy_pnext_chain(this,create_info->pNext,alloc,&pVVar6->pNext,(DynamicStateInfo *)0x0,0);
  if (bVar5) {
    *out_create_info = pVVar6;
  }
  return bVar5;
}

Assistant:

bool StateRecorder::Impl::copy_descriptor_set_layout(
	const VkDescriptorSetLayoutCreateInfo *create_info, ScratchAllocator &alloc,
	VkDescriptorSetLayoutCreateInfo **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);
	info->pBindings = copy(info->pBindings, info->bindingCount, alloc);

	for (uint32_t i = 0; i < info->bindingCount; i++)
	{
		auto &b = const_cast<VkDescriptorSetLayoutBinding &>(info->pBindings[i]);
		if (b.pImmutableSamplers &&
		    (b.descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER ||
		     b.descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER))
		{
			b.pImmutableSamplers = copy(b.pImmutableSamplers, b.descriptorCount, alloc);
		}
		else
		{
			b.pImmutableSamplers = nullptr;
		}
	}

	if (!copy_pnext_chain(create_info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_create_info = info;
	return true;
}